

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O1

int SMCompatible_Dense(SUNMatrix A,SUNMatrix B)

{
  SUNMatrix_ID SVar1;
  uint uVar2;
  
  SVar1 = SUNMatGetID(A);
  uVar2 = 0;
  if (SVar1 == SUNMATRIX_DENSE) {
    SVar1 = SUNMatGetID(B);
    if (SVar1 == SUNMATRIX_DENSE) {
      if (*A->content == *B->content) {
        uVar2 = (uint)(*(int *)((long)A->content + 4) == *(int *)((long)B->content + 4));
      }
    }
  }
  return uVar2;
}

Assistant:

static booleantype SMCompatible_Dense(SUNMatrix A, SUNMatrix B)
{
  /* both matrices must be SUNMATRIX_DENSE */
  if (SUNMatGetID(A) != SUNMATRIX_DENSE)
    return SUNFALSE;
  if (SUNMatGetID(B) != SUNMATRIX_DENSE)
    return SUNFALSE;

  /* both matrices must have the same shape */
  if (SM_ROWS_D(A) != SM_ROWS_D(B))
    return SUNFALSE;
  if (SM_COLUMNS_D(A) != SM_COLUMNS_D(B))
    return SUNFALSE;

  return SUNTRUE;
}